

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * cfd::js::api::json::JsonMappingApi::DecodeBase64
                   (string *__return_storage_ptr__,string *request_message)

{
  function<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&)> *in_RCX;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = UtilStructApi::DecodeBase64;
  local_18._8_8_ =
       std::
       _Function_handler<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&),_cfd::js::api::HexDataStruct_(*)(const_cfd::js::api::Base64DataStruct_&)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<cfd::js::api::HexDataStruct_(const_cfd::js::api::Base64DataStruct_&),_cfd::js::api::HexDataStruct_(*)(const_cfd::js::api::Base64DataStruct_&)>
       ::_M_manager;
  ExecuteJsonApi<cfd::js::api::json::Base64Data,cfd::js::api::json::HexData,cfd::js::api::Base64DataStruct,cfd::js::api::HexDataStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,in_RCX);
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::DecodeBase64(const std::string &request_message) {
  return ExecuteJsonApi<
      api::json::Base64Data, api::json::HexData, api::Base64DataStruct,
      api::HexDataStruct>(request_message, UtilStructApi::DecodeBase64);
}